

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

TestCaseGroup * deqp::egl::createRobustnessTests(EglTestContext *eglTestCtx)

{
  TestCaseGroup *pTVar1;
  undefined8 uVar2;
  int iVar3;
  TestCaseGroup *pTVar4;
  TestCaseGroup *this;
  TestCaseGroup *this_00;
  TestCaseGroup *pTVar5;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *pTVar6;
  TestNode *pTVar7;
  char *pcVar8;
  string *psVar9;
  char *pcVar10;
  ResourceType *pRVar11;
  RobustAccessType *pRVar12;
  Params local_2060;
  undefined1 local_2001;
  Params local_2000;
  Params *local_1fa8;
  Params *test_3;
  int testNdx_3;
  ContextResetType local_1f94;
  RobustAccessType local_1f90;
  allocator<char> local_1f89;
  string local_1f88;
  allocator<char> local_1f61;
  string local_1f60;
  FixedFunctionType local_1f40;
  ContextResetType local_1f3c;
  RobustAccessType local_1f38;
  allocator<char> local_1f31;
  string local_1f30;
  allocator<char> local_1f09;
  string local_1f08;
  FixedFunctionType local_1ee8;
  ContextResetType local_1ee4;
  RobustAccessType local_1ee0;
  allocator<char> local_1ed9;
  string local_1ed8;
  allocator<char> local_1eb1;
  string local_1eb0;
  FixedFunctionType local_1e90;
  ContextResetType local_1e8c;
  RobustAccessType local_1e88;
  allocator<char> local_1e81;
  string local_1e80;
  allocator<char> local_1e59;
  string local_1e58;
  Params *local_1e38;
  TestCaseGroup *local_1e30;
  TestCaseGroup *fixedFunctionResetStatusNonRobustTestGroup;
  TestCaseGroup *fixedFunctionResetStatusTestGroup;
  TestCaseGroup *outOfBoundsResetNonRobustTestGroup;
  TestCaseGroup *outOfBoundsResetWriteAccessNonRobustTestGroup;
  TestCaseGroup *outOfBoundsResetReadAccessNonRobustTestGroup;
  TestCaseGroup *outOfBoundsResetTestGroup;
  TestCaseGroup *outOfBoundsResetWriteAccessTestGroup;
  TestCaseGroup *outOfBoundsResetReadAccessTestGroup;
  Params local_1de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d90;
  undefined1 local_1d69;
  Params local_1d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d10;
  undefined1 local_1ce9;
  Params local_1ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c90;
  undefined1 local_1c69;
  Params local_1c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c10;
  undefined1 local_1be9;
  Params local_1be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b90;
  undefined1 local_1b69;
  Params local_1b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b10;
  Params *local_1af0;
  Params *test_2;
  int testNdx_2;
  ResourceType local_1adc;
  ShaderType local_1ad8;
  ContextResetType local_1ad4;
  RobustAccessType local_1ad0;
  allocator<char> local_1ac9;
  string local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  ReadWriteType local_1a80;
  ResourceType local_1a7c;
  ShaderType local_1a78;
  ContextResetType local_1a74;
  RobustAccessType local_1a70;
  allocator<char> local_1a69;
  string local_1a68;
  allocator<char> local_1a41;
  string local_1a40;
  ReadWriteType local_1a20;
  ResourceType local_1a1c;
  ShaderType local_1a18;
  ContextResetType local_1a14;
  RobustAccessType local_1a10;
  allocator<char> local_1a09;
  string local_1a08;
  allocator<char> local_19e1;
  string local_19e0;
  ReadWriteType local_19c0;
  ResourceType local_19bc;
  ShaderType local_19b8;
  ContextResetType local_19b4;
  RobustAccessType local_19b0;
  allocator<char> local_19a9;
  string local_19a8;
  allocator<char> local_1981;
  string local_1980;
  ReadWriteType local_1960;
  ResourceType local_195c;
  ShaderType local_1958;
  ContextResetType local_1954;
  RobustAccessType local_1950;
  allocator<char> local_1949;
  string local_1948;
  allocator<char> local_1921;
  string local_1920;
  ReadWriteType local_1900;
  ResourceType local_18fc;
  ShaderType local_18f8;
  ContextResetType local_18f4;
  RobustAccessType local_18f0;
  allocator<char> local_18e9;
  string local_18e8;
  allocator<char> local_18c1;
  string local_18c0;
  ReadWriteType local_18a0;
  ResourceType local_189c;
  ShaderType local_1898;
  ContextResetType local_1894;
  RobustAccessType local_1890;
  allocator<char> local_1889;
  string local_1888;
  allocator<char> local_1861;
  string local_1860;
  ReadWriteType local_1840;
  ResourceType local_183c;
  ShaderType local_1838;
  ContextResetType local_1834;
  RobustAccessType local_1830;
  allocator<char> local_1829;
  string local_1828;
  allocator<char> local_1801;
  string local_1800;
  ReadWriteType local_17e0;
  ResourceType local_17dc;
  ShaderType local_17d8;
  ContextResetType local_17d4;
  RobustAccessType local_17d0;
  allocator<char> local_17c9;
  string local_17c8;
  allocator<char> local_17a1;
  string local_17a0;
  ReadWriteType local_1780;
  ResourceType local_177c;
  ShaderType local_1778;
  ContextResetType local_1774;
  RobustAccessType local_1770;
  allocator<char> local_1769;
  string local_1768;
  allocator<char> local_1741;
  string local_1740;
  ReadWriteType local_1720;
  ResourceType local_171c;
  ShaderType local_1718;
  ContextResetType local_1714;
  RobustAccessType local_1710;
  allocator<char> local_1709;
  string local_1708;
  allocator<char> local_16e1;
  string local_16e0;
  ReadWriteType local_16c0;
  ResourceType local_16bc;
  ShaderType local_16b8;
  ContextResetType local_16b4;
  RobustAccessType local_16b0;
  allocator<char> local_16a9;
  string local_16a8;
  allocator<char> local_1681;
  string local_1680;
  ReadWriteType local_1660;
  ResourceType local_165c;
  ShaderType local_1658;
  ContextResetType local_1654;
  RobustAccessType local_1650;
  allocator<char> local_1649;
  string local_1648;
  allocator<char> local_1621;
  string local_1620;
  ReadWriteType local_1600;
  ResourceType local_15fc;
  ShaderType local_15f8;
  ContextResetType local_15f4;
  RobustAccessType local_15f0;
  allocator<char> local_15e9;
  string local_15e8;
  allocator<char> local_15c1;
  string local_15c0;
  ReadWriteType local_15a0;
  ResourceType local_159c;
  ShaderType local_1598;
  ContextResetType local_1594;
  RobustAccessType local_1590;
  allocator<char> local_1589;
  string local_1588;
  allocator<char> local_1561;
  string local_1560;
  ReadWriteType local_1540;
  ResourceType local_153c;
  ShaderType local_1538;
  ContextResetType local_1534;
  RobustAccessType local_1530;
  allocator<char> local_1529;
  string local_1528;
  allocator<char> local_1501;
  string local_1500;
  ReadWriteType local_14e0;
  ResourceType local_14dc;
  ShaderType local_14d8;
  ContextResetType local_14d4;
  RobustAccessType local_14d0;
  allocator<char> local_14c9;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  ReadWriteType local_1480;
  ResourceType local_147c;
  ShaderType local_1478;
  ContextResetType local_1474;
  RobustAccessType local_1470;
  allocator<char> local_1469;
  string local_1468;
  allocator<char> local_1441;
  string local_1440;
  ReadWriteType local_1420;
  ResourceType local_141c;
  ShaderType local_1418;
  ContextResetType local_1414;
  RobustAccessType local_1410;
  allocator<char> local_1409;
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  ReadWriteType local_13c0;
  ResourceType local_13bc;
  ShaderType local_13b8;
  ContextResetType local_13b4;
  RobustAccessType local_13b0;
  allocator<char> local_13a9;
  string local_13a8;
  allocator<char> local_1381;
  string local_1380;
  ReadWriteType local_1360;
  ResourceType local_135c;
  ShaderType local_1358;
  ContextResetType local_1354;
  RobustAccessType local_1350;
  allocator<char> local_1349;
  string local_1348;
  allocator<char> local_1321;
  string local_1320;
  ReadWriteType local_1300;
  ResourceType local_12fc;
  ShaderType local_12f8;
  ContextResetType local_12f4;
  RobustAccessType local_12f0;
  allocator<char> local_12e9;
  string local_12e8;
  allocator<char> local_12c1;
  string local_12c0;
  ReadWriteType local_12a0;
  ResourceType local_129c;
  ShaderType local_1298;
  ContextResetType local_1294;
  RobustAccessType local_1290;
  allocator<char> local_1289;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  ReadWriteType local_1240;
  ResourceType local_123c;
  ShaderType local_1238;
  ContextResetType local_1234;
  RobustAccessType local_1230;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  Params *local_11e0;
  undefined1 local_11d1;
  Params local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  undefined1 local_1151;
  Params local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  undefined1 local_10d1;
  Params local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  undefined1 local_1051;
  Params local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  undefined1 local_fd1;
  Params local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  undefined1 local_f51;
  Params local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  Params *local_ed8;
  Params *test_1;
  int testNdx_1;
  ResourceType local_ec4;
  ShaderType local_ec0;
  ContextResetType local_ebc;
  RobustAccessType local_eb8;
  allocator<char> local_eb1;
  string local_eb0;
  allocator<char> local_e89;
  string local_e88;
  ReadWriteType local_e68;
  ResourceType local_e64;
  ShaderType local_e60;
  ContextResetType local_e5c;
  RobustAccessType local_e58;
  allocator<char> local_e51;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  ReadWriteType local_e08;
  ResourceType local_e04;
  ShaderType local_e00;
  ContextResetType local_dfc;
  RobustAccessType local_df8;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  ReadWriteType local_da8;
  ResourceType local_da4;
  ShaderType local_da0;
  ContextResetType local_d9c;
  RobustAccessType local_d98;
  allocator<char> local_d91;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  ReadWriteType local_d48;
  ResourceType local_d44;
  ShaderType local_d40;
  ContextResetType local_d3c;
  RobustAccessType local_d38;
  allocator<char> local_d31;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  ReadWriteType local_ce8;
  ResourceType local_ce4;
  ShaderType local_ce0;
  ContextResetType local_cdc;
  RobustAccessType local_cd8;
  allocator<char> local_cd1;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  ReadWriteType local_c88;
  ResourceType local_c84;
  ShaderType local_c80;
  ContextResetType local_c7c;
  RobustAccessType local_c78;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  ReadWriteType local_c28;
  ResourceType local_c24;
  ShaderType local_c20;
  ContextResetType local_c1c;
  RobustAccessType local_c18;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  ReadWriteType local_bc8;
  ResourceType local_bc4;
  ShaderType local_bc0;
  ContextResetType local_bbc;
  RobustAccessType local_bb8;
  allocator<char> local_bb1;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  ReadWriteType local_b68;
  ResourceType local_b64;
  ShaderType local_b60;
  ContextResetType local_b5c;
  RobustAccessType local_b58;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  ReadWriteType local_b08;
  ResourceType local_b04;
  ShaderType local_b00;
  ContextResetType local_afc;
  RobustAccessType local_af8;
  allocator<char> local_af1;
  string local_af0;
  allocator<char> local_ac9;
  string local_ac8;
  ReadWriteType local_aa8;
  ResourceType local_aa4;
  ShaderType local_aa0;
  ContextResetType local_a9c;
  RobustAccessType local_a98;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  ReadWriteType local_a48;
  ResourceType local_a44;
  ShaderType local_a40;
  ContextResetType local_a3c;
  RobustAccessType local_a38;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  ReadWriteType local_9e8;
  ResourceType local_9e4;
  ShaderType local_9e0;
  ContextResetType local_9dc;
  RobustAccessType local_9d8;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  ReadWriteType local_988;
  ResourceType local_984;
  ShaderType local_980;
  ContextResetType local_97c;
  RobustAccessType local_978;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  ReadWriteType local_928;
  ResourceType local_924;
  ShaderType local_920;
  ContextResetType local_91c;
  RobustAccessType local_918;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  ReadWriteType local_8c8;
  ResourceType local_8c4;
  ShaderType local_8c0;
  ContextResetType local_8bc;
  RobustAccessType local_8b8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  ReadWriteType local_868;
  ResourceType local_864;
  ShaderType local_860;
  ContextResetType local_85c;
  RobustAccessType local_858;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  ReadWriteType local_808;
  ResourceType local_804;
  ShaderType local_800;
  ContextResetType local_7fc;
  RobustAccessType local_7f8;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  ReadWriteType local_7a8;
  ResourceType local_7a4;
  ShaderType local_7a0;
  ContextResetType local_79c;
  RobustAccessType local_798;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  ReadWriteType local_748;
  ResourceType local_744;
  ShaderType local_740;
  ContextResetType local_73c;
  RobustAccessType local_738;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  ReadWriteType local_6e8;
  ResourceType local_6e4;
  ShaderType local_6e0;
  ContextResetType local_6dc;
  RobustAccessType local_6d8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  ReadWriteType local_688;
  ResourceType local_684;
  ShaderType local_680;
  ContextResetType local_67c;
  RobustAccessType local_678;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  ReadWriteType local_628;
  ResourceType local_624;
  ShaderType local_620;
  ContextResetType local_61c;
  RobustAccessType local_618;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  Params *local_5c8;
  TestCaseGroup *local_5c0;
  TestCaseGroup *localReadArrayResetNonRobustTestGroup;
  TestCaseGroup *localWriteArrayResetNonRobustTestGroup;
  TestCaseGroup *ssboReadArrayResetNonRobustTestGroup;
  TestCaseGroup *ssboWriteArrayResetNonRobustTestGroup;
  TestCaseGroup *uboWriteArrayResetNonRobustTestGroup;
  TestCaseGroup *uboReadArrayResetNonRobustTestGroup;
  TestCaseGroup *localReadArrayResetTestGroup;
  TestCaseGroup *localWriteArrayResetTestGroup;
  TestCaseGroup *ssboReadArrayResetTestGroup;
  TestCaseGroup *ssboWriteArrayResetTestGroup;
  TestCaseGroup *uboWriteArrayResetTestGroup;
  TestCaseGroup *uboReadArrayResetTestGroup;
  Params local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  undefined1 local_4d9;
  Params local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_459;
  Params local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3d9;
  Params local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_359;
  Params local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  Params *local_2e0;
  Params *test;
  undefined1 local_2cd;
  int testNdx;
  ContextResetType local_2c8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  ShaderType local_274;
  ContextResetType local_270;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  ShaderType local_21c;
  ContextResetType local_218;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  ShaderType local_1c4;
  ContextResetType local_1c0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  Params *local_170;
  TestCaseGroup *local_168;
  TestCaseGroup *infiniteLoopRecoverTestGroup;
  TestCaseGroup *infiniteLoopSharedTestGroup;
  TestCaseGroup *infiniteLoopQueryTestGroup;
  TestCaseGroup *infiniteLoopSyncTestGroup;
  TestCaseGroup *infiniteLoopResetTestGroup;
  undefined1 local_138 [8];
  string recoverScenarioDescription;
  undefined1 local_110 [8];
  string sharedScenarioDescription;
  undefined1 local_e8 [8];
  string queryScenarioDescription;
  undefined1 local_c0 [8];
  string syncScenarioDescription;
  undefined1 local_98 [8];
  string resetScenarioDescription;
  TestCaseGroup *outOfBoundsNonRobustTestGroup;
  TestCaseGroup *outOfBoundsTestGroup;
  TestCaseGroup *infiniteLoopTestGroup;
  TestCaseGroup *fixedFunctionNonRobustTestGroup;
  TestCaseGroup *fixedFunctionTestGroup;
  TestCaseGroup *shadersTestGroup;
  TestCaseGroup *negativeContextTestGroup;
  TestCaseGroup *contextResetTestGroup;
  TestCaseGroup *contextCreationTestGroup;
  undefined1 local_20 [8];
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  EglTestContext *eglTestCtx_local;
  
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data._8_8_ = eglTestCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"robustness","KHR_robustness tests");
  de::DefaultDeleter<deqp::egl::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<deqp::egl::TestCaseGroup> *)((long)&contextCreationTestGroup + 3));
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
          local_20,pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"create_context","Test valid context_creation attributes");
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,(EglTestContext *)
                  group.
                  super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                  .m_data._8_8_,"reset_context","Test context resets scenarios");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(EglTestContext *)
                     group.
                     super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                     .m_data._8_8_,"negative_context","Test invalid context creation attributes");
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shaders","Shader specific context reset tests");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(EglTestContext *)
                     group.
                     super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                     .m_data._8_8_,"fixed_function_pipeline",
             "Fixed function pipeline context reset tests with robust context");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(EglTestContext *)
                     group.
                     super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                     .m_data._8_8_,"fixed_function_pipeline_non_robust",
             "Fixed function pipeline context reset tests with non-robust context");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(EglTestContext *)
                     group.
                     super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                     .m_data._8_8_,"infinite_loop","Infinite loop scenarios");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(EglTestContext *)
                     group.
                     super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                     .m_data._8_8_,"out_of_bounds",
             "Out of bounds access scenarios with robust context");
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"out_of_bounds_non_robust",
             "Out of bounds access scenarios with non-robust context");
  resetScenarioDescription.field_2._8_8_ = pTVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"query error states and reset notifications",
             (allocator<char> *)(syncScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(syncScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"query sync status with getSynciv()",
             (allocator<char> *)(queryScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(queryScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"check availability of query result with getQueryObjectiv()",
             (allocator<char> *)(sharedScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(sharedScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,"check reset notification is propagated to shared context",
             (allocator<char> *)(recoverScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(recoverScenarioDescription.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"delete the old context and create a new one",
             (allocator<char> *)((long)&infiniteLoopResetTestGroup + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&infiniteLoopResetTestGroup + 7));
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  infiniteLoopSyncTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"sync_status",
             "Tests that query the sync status after a context reset has occurred");
  infiniteLoopQueryTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"query_status",
             "Tests that query the state of a query object after a context reset has occurred");
  infiniteLoopSharedTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shared_context_status",
             "Tests that query the state of a shared context after a reset has occurred");
  infiniteLoopRecoverTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"recover_from_reset",
             "Tests that attempt to create a new context after a context has occurred");
  local_168 = pTVar6;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases == '\0') {
    iVar3 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_infiniteLoopCases);
    if (iVar3 != 0) {
      local_2cd = 1;
      local_170 = createRobustnessTests::s_infiniteLoopCases;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"vertex",&local_191);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"Provoke a context reset in vertex shader and ",&local_1b9);
      local_1c0 = CONTEXTRESETTYPE_INFINITE_LOOP;
      local_1c4 = SHADERTYPE_VERT;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases,&local_190,&local_1b8,&local_1c0,
                 &local_1c4);
      local_170 = (Params *)0x680168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"fragment",&local_1e9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"Provoke a context reset in fragment shader and ",&local_211);
      local_218 = CONTEXTRESETTYPE_INFINITE_LOOP;
      local_21c = SHADERTYPE_FRAG;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 1,&local_1e8,&local_210,&local_218,
                 &local_21c);
      local_170 = (Params *)0x6801c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"vertex_and_fragment",&local_241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"Provoke a context reset in vertex and fragment shader and ",
                 &local_269);
      local_270 = CONTEXTRESETTYPE_INFINITE_LOOP;
      local_274 = SHADERTYPE_VERT_AND_FRAG;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 2,&local_240,&local_268,&local_270,
                 &local_274);
      local_170 = (Params *)0x680218;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"compute",&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"Provoke a context reset in compute shader and ",&local_2c1);
      local_2c8 = CONTEXTRESETTYPE_INFINITE_LOOP;
      testNdx = 2;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 3,&local_298,&local_2c0,&local_2c8,
                 (ShaderType *)&testNdx);
      local_2cd = 0;
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases);
    }
  }
  for (test._4_4_ = 0; pTVar1 = infiniteLoopSyncTestGroup, test._4_4_ < 4;
      test._4_4_ = test._4_4_ + 1) {
    local_2e0 = createRobustnessTests::s_infiniteLoopCases + test._4_4_;
    pTVar7 = (TestNode *)operator_new(0xf8);
    uVar2 = group.
            super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
            .m_data._8_8_;
    local_359 = 1;
    (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_2e0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                       ((Params *)local_2e0);
    std::operator+(&local_300,psVar9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_358,local_2e0);
    anon_unknown_1::BasicResetCase::BasicResetCase
              ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_358);
    local_359 = 0;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_358);
    std::__cxx11::string::~string((string *)&local_300);
    pTVar1 = infiniteLoopQueryTestGroup;
    pTVar7 = (TestNode *)operator_new(0xf8);
    uVar2 = group.
            super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
            .m_data._8_8_;
    local_3d9 = 1;
    (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_2e0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                       ((Params *)local_2e0);
    std::operator+(&local_380,psVar9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_3d8,local_2e0);
    anon_unknown_1::SyncObjectResetCase::SyncObjectResetCase
              ((SyncObjectResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_3d8);
    local_3d9 = 0;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_3d8);
    std::__cxx11::string::~string((string *)&local_380);
    pTVar1 = infiniteLoopSharedTestGroup;
    pTVar7 = (TestNode *)operator_new(0xf8);
    uVar2 = group.
            super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
            .m_data._8_8_;
    local_459 = 1;
    (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_2e0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                       ((Params *)local_2e0);
    std::operator+(&local_400,psVar9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_458,local_2e0);
    anon_unknown_1::QueryObjectResetCase::QueryObjectResetCase
              ((QueryObjectResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_458);
    local_459 = 0;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_458);
    std::__cxx11::string::~string((string *)&local_400);
    pTVar1 = infiniteLoopRecoverTestGroup;
    pTVar7 = (TestNode *)operator_new(0xf8);
    uVar2 = group.
            super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
            .m_data._8_8_;
    local_4d9 = 1;
    (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_2e0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                       ((Params *)local_2e0);
    std::operator+(&local_480,psVar9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_4d8,local_2e0);
    anon_unknown_1::SharedContextResetCase::SharedContextResetCase
              ((SharedContextResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_4d8);
    local_4d9 = 0;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_4d8);
    std::__cxx11::string::~string((string *)&local_480);
    pTVar6 = local_168;
    pTVar7 = (TestNode *)operator_new(0xf8);
    uVar2 = group.
            super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
            .m_data._8_8_;
    uboReadArrayResetTestGroup._7_1_ = 1;
    (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_2e0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                       ((Params *)local_2e0);
    std::operator+(&local_500,psVar9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::RobustnessTestCase::Params::Params(&local_558,local_2e0);
    anon_unknown_1::RecoverFromResetCase::RecoverFromResetCase
              ((RecoverFromResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_558);
    uboReadArrayResetTestGroup._7_1_ = 0;
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
    anon_unknown_1::RobustnessTestCase::Params::~Params(&local_558);
    std::__cxx11::string::~string((string *)&local_500);
  }
  tcu::TestNode::addChild((TestNode *)this_03,&infiniteLoopSyncTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this_03,&infiniteLoopQueryTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this_03,&infiniteLoopSharedTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this_03,&infiniteLoopRecoverTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)local_168);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"uniform_block","Uniform Block Accesses");
  uboWriteArrayResetTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"uniform_block","Uniform Block Accesses");
  ssboWriteArrayResetTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shader_storage_block","Shader Storage Block accesses");
  ssboReadArrayResetTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shader_storage_block","Shader Storage Block accesses");
  localWriteArrayResetTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"local_array","Local array accesses");
  localReadArrayResetTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"local_array","Local array accesses");
  uboReadArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"uniform_block","Uniform Block Accesses");
  uboWriteArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"uniform_block","Uniform Block Accesses");
  ssboWriteArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shader_storage_block","Shader Storage Block accesses");
  ssboReadArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"shader_storage_block","Shader Storage Block accesses");
  localWriteArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"local_array","Local array accesses");
  localReadArrayResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"local_array","Local array accesses");
  local_5c0 = pTVar6;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases == '\0') {
    iVar3 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_outOfBoundReadCases);
    if (iVar3 != 0) {
      test_1._7_1_ = 1;
      local_5c8 = createRobustnessTests::s_outOfBoundReadCases;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"vertex",&local_5e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Provoke a context reset in vertex shader and ",&local_611);
      local_618 = ROBUSTACCESS_TRUE;
      local_61c = CONTEXTRESETTYPE_SHADER_OOB;
      local_620 = SHADERTYPE_VERT;
      local_624 = RESOURCETYPE_UBO;
      local_628 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases,&local_5e8,&local_610,&local_618,
                 &local_61c,&local_620,&local_624,&local_628);
      local_5c8 = (Params *)0x6802d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"fragment",&local_649)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_670,"Provoke a context reset in fragment shader and ",&local_671);
      local_678 = ROBUSTACCESS_TRUE;
      local_67c = CONTEXTRESETTYPE_SHADER_OOB;
      local_680 = SHADERTYPE_FRAG;
      local_684 = RESOURCETYPE_UBO;
      local_688 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 1,&local_648,&local_670,&local_678,
                 &local_67c,&local_680,&local_684,&local_688);
      local_5c8 = (Params *)0x680330;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"vertex_and_fragment",&local_6a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Provoke a context reset in vertex and fragment shader and ",
                 &local_6d1);
      local_6d8 = ROBUSTACCESS_TRUE;
      local_6dc = CONTEXTRESETTYPE_SHADER_OOB;
      local_6e0 = SHADERTYPE_VERT_AND_FRAG;
      local_6e4 = RESOURCETYPE_UBO;
      local_6e8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 2,&local_6a8,&local_6d0,&local_6d8,
                 &local_6dc,&local_6e0,&local_6e4,&local_6e8);
      local_5c8 = (Params *)0x680388;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"compute",&local_709);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_730,"Provoke a context reset in compute shader and ",&local_731);
      local_738 = ROBUSTACCESS_TRUE;
      local_73c = CONTEXTRESETTYPE_SHADER_OOB;
      local_740 = SHADERTYPE_COMPUTE;
      local_744 = RESOURCETYPE_UBO;
      local_748 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 3,&local_708,&local_730,&local_738,
                 &local_73c,&local_740,&local_744,&local_748);
      local_5c8 = (Params *)0x6803e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"vertex",&local_769);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_790,"Provoke a context reset in vertex shader and ",&local_791);
      local_798 = ROBUSTACCESS_TRUE;
      local_79c = CONTEXTRESETTYPE_SHADER_OOB;
      local_7a0 = SHADERTYPE_VERT;
      local_7a4 = RESOURCETYPE_SSBO;
      local_7a8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 4,&local_768,&local_790,&local_798,
                 &local_79c,&local_7a0,&local_7a4,&local_7a8);
      local_5c8 = (Params *)0x680438;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"fragment",&local_7c9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f0,"Provoke a context reset in fragment shader and ",&local_7f1);
      local_7f8 = ROBUSTACCESS_TRUE;
      local_7fc = CONTEXTRESETTYPE_SHADER_OOB;
      local_800 = SHADERTYPE_FRAG;
      local_804 = RESOURCETYPE_SSBO;
      local_808 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 5,&local_7c8,&local_7f0,&local_7f8,
                 &local_7fc,&local_800,&local_804,&local_808);
      local_5c8 = (Params *)0x680490;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,"vertex_and_fragment",&local_829);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"Provoke a context reset in vertex and fragment shader and ",
                 &local_851);
      local_858 = ROBUSTACCESS_TRUE;
      local_85c = CONTEXTRESETTYPE_SHADER_OOB;
      local_860 = SHADERTYPE_VERT_AND_FRAG;
      local_864 = RESOURCETYPE_SSBO;
      local_868 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 6,&local_828,&local_850,&local_858,
                 &local_85c,&local_860,&local_864,&local_868);
      local_5c8 = (Params *)0x6804e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"compute",&local_889);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b0,"Provoke a context reset in compute shader and ",&local_8b1);
      local_8b8 = ROBUSTACCESS_TRUE;
      local_8bc = CONTEXTRESETTYPE_SHADER_OOB;
      local_8c0 = SHADERTYPE_COMPUTE;
      local_8c4 = RESOURCETYPE_SSBO;
      local_8c8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 7,&local_888,&local_8b0,&local_8b8,
                 &local_8bc,&local_8c0,&local_8c4,&local_8c8);
      local_5c8 = (Params *)0x680540;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"vertex",&local_8e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"Provoke a context reset in vertex shader and ",&local_911);
      local_918 = ROBUSTACCESS_TRUE;
      local_91c = CONTEXTRESETTYPE_SHADER_OOB;
      local_920 = SHADERTYPE_VERT;
      local_924 = RESOURCETYPE_LOCAL_ARRAY;
      local_928 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 8,&local_8e8,&local_910,&local_918,
                 &local_91c,&local_920,&local_924,&local_928);
      local_5c8 = (Params *)0x680598;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"fragment",&local_949)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_970,"Provoke a context reset in fragment shader and ",&local_971);
      local_978 = ROBUSTACCESS_TRUE;
      local_97c = CONTEXTRESETTYPE_SHADER_OOB;
      local_980 = SHADERTYPE_FRAG;
      local_984 = RESOURCETYPE_LOCAL_ARRAY;
      local_988 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 9,&local_948,&local_970,&local_978,
                 &local_97c,&local_980,&local_984,&local_988);
      local_5c8 = (Params *)0x6805f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9a8,"vertex_and_fragment",&local_9a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d0,"Provoke a context reset in vertex and fragment shader and ",
                 &local_9d1);
      local_9d8 = ROBUSTACCESS_TRUE;
      local_9dc = CONTEXTRESETTYPE_SHADER_OOB;
      local_9e0 = SHADERTYPE_VERT_AND_FRAG;
      local_9e4 = RESOURCETYPE_LOCAL_ARRAY;
      local_9e8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 10,&local_9a8,&local_9d0,&local_9d8,
                 &local_9dc,&local_9e0,&local_9e4,&local_9e8);
      local_5c8 = (Params *)0x680648;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"compute",&local_a09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a30,"Provoke a context reset in compute shader and ",&local_a31);
      local_a38 = ROBUSTACCESS_TRUE;
      local_a3c = CONTEXTRESETTYPE_SHADER_OOB;
      local_a40 = SHADERTYPE_COMPUTE;
      local_a44 = RESOURCETYPE_LOCAL_ARRAY;
      local_a48 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xb,&local_a08,&local_a30,&local_a38
                 ,&local_a3c,&local_a40,&local_a44,&local_a48);
      local_5c8 = (Params *)0x6806a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a68,"vertex",&local_a69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a90,"Provoke a context reset in vertex shader and ",&local_a91);
      local_a98 = ROBUSTACCESS_FALSE;
      local_a9c = CONTEXTRESETTYPE_SHADER_OOB;
      local_aa0 = SHADERTYPE_VERT;
      local_aa4 = RESOURCETYPE_UBO;
      local_aa8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xc,&local_a68,&local_a90,&local_a98
                 ,&local_a9c,&local_aa0,&local_aa4,&local_aa8);
      local_5c8 = (Params *)0x6806f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"fragment",&local_ac9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af0,"Provoke a context reset in fragment shader and ",&local_af1);
      local_af8 = ROBUSTACCESS_FALSE;
      local_afc = CONTEXTRESETTYPE_SHADER_OOB;
      local_b00 = SHADERTYPE_FRAG;
      local_b04 = RESOURCETYPE_UBO;
      local_b08 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xd,&local_ac8,&local_af0,&local_af8
                 ,&local_afc,&local_b00,&local_b04,&local_b08);
      local_5c8 = (Params *)0x680750;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,"vertex_and_fragment",&local_b29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b50,"Provoke a context reset in vertex and fragment shader and ",
                 &local_b51);
      local_b58 = ROBUSTACCESS_FALSE;
      local_b5c = CONTEXTRESETTYPE_SHADER_OOB;
      local_b60 = SHADERTYPE_VERT_AND_FRAG;
      local_b64 = RESOURCETYPE_UBO;
      local_b68 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xe,&local_b28,&local_b50,&local_b58
                 ,&local_b5c,&local_b60,&local_b64,&local_b68);
      local_5c8 = (Params *)0x6807a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b88,"compute",&local_b89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bb0,"Provoke a context reset in compute shader and ",&local_bb1);
      local_bb8 = ROBUSTACCESS_FALSE;
      local_bbc = CONTEXTRESETTYPE_SHADER_OOB;
      local_bc0 = SHADERTYPE_COMPUTE;
      local_bc4 = RESOURCETYPE_UBO;
      local_bc8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xf,&local_b88,&local_bb0,&local_bb8
                 ,&local_bbc,&local_bc0,&local_bc4,&local_bc8);
      local_5c8 = (Params *)0x680800;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"vertex",&local_be9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c10,"Provoke a context reset in vertex shader and ",&local_c11);
      local_c18 = ROBUSTACCESS_FALSE;
      local_c1c = CONTEXTRESETTYPE_SHADER_OOB;
      local_c20 = SHADERTYPE_VERT;
      local_c24 = RESOURCETYPE_SSBO;
      local_c28 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x10,&local_be8,&local_c10,
                 &local_c18,&local_c1c,&local_c20,&local_c24,&local_c28);
      local_5c8 = (Params *)0x680858;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"fragment",&local_c49)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c70,"Provoke a context reset in fragment shader and ",&local_c71);
      local_c78 = ROBUSTACCESS_FALSE;
      local_c7c = CONTEXTRESETTYPE_SHADER_OOB;
      local_c80 = SHADERTYPE_FRAG;
      local_c84 = RESOURCETYPE_SSBO;
      local_c88 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x11,&local_c48,&local_c70,
                 &local_c78,&local_c7c,&local_c80,&local_c84,&local_c88);
      local_5c8 = (Params *)0x6808b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ca8,"vertex_and_fragment",&local_ca9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd0,"Provoke a context reset in vertex and fragment shader and ",
                 &local_cd1);
      local_cd8 = ROBUSTACCESS_FALSE;
      local_cdc = CONTEXTRESETTYPE_SHADER_OOB;
      local_ce0 = SHADERTYPE_VERT_AND_FRAG;
      local_ce4 = RESOURCETYPE_SSBO;
      local_ce8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x12,&local_ca8,&local_cd0,
                 &local_cd8,&local_cdc,&local_ce0,&local_ce4,&local_ce8);
      local_5c8 = (Params *)0x680908;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"compute",&local_d09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d30,"Provoke a context reset in compute shader and ",&local_d31);
      local_d38 = ROBUSTACCESS_FALSE;
      local_d3c = CONTEXTRESETTYPE_SHADER_OOB;
      local_d40 = SHADERTYPE_COMPUTE;
      local_d44 = RESOURCETYPE_SSBO;
      local_d48 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x13,&local_d08,&local_d30,
                 &local_d38,&local_d3c,&local_d40,&local_d44,&local_d48);
      local_5c8 = (Params *)0x680960;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"vertex",&local_d69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d90,"Provoke a context reset in vertex shader and ",&local_d91);
      local_d98 = ROBUSTACCESS_FALSE;
      local_d9c = CONTEXTRESETTYPE_SHADER_OOB;
      local_da0 = SHADERTYPE_VERT;
      local_da4 = RESOURCETYPE_LOCAL_ARRAY;
      local_da8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x14,&local_d68,&local_d90,
                 &local_d98,&local_d9c,&local_da0,&local_da4,&local_da8);
      local_5c8 = (Params *)0x6809b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"fragment",&local_dc9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_df0,"Provoke a context reset in fragment shader and ",&local_df1);
      local_df8 = ROBUSTACCESS_FALSE;
      local_dfc = CONTEXTRESETTYPE_SHADER_OOB;
      local_e00 = SHADERTYPE_FRAG;
      local_e04 = RESOURCETYPE_LOCAL_ARRAY;
      local_e08 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x15,&local_dc8,&local_df0,
                 &local_df8,&local_dfc,&local_e00,&local_e04,&local_e08);
      local_5c8 = (Params *)0x680a10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e28,"vertex_and_fragment",&local_e29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e50,"Provoke a context reset in vertex and fragment shader and ",
                 &local_e51);
      local_e58 = ROBUSTACCESS_FALSE;
      local_e5c = CONTEXTRESETTYPE_SHADER_OOB;
      local_e60 = SHADERTYPE_VERT_AND_FRAG;
      local_e64 = RESOURCETYPE_LOCAL_ARRAY;
      local_e68 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x16,&local_e28,&local_e50,
                 &local_e58,&local_e5c,&local_e60,&local_e64,&local_e68);
      local_5c8 = (Params *)0x680a68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e88,"compute",&local_e89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_eb0,"Provoke a context reset in compute shader and ",&local_eb1);
      local_eb8 = ROBUSTACCESS_FALSE;
      local_ebc = CONTEXTRESETTYPE_SHADER_OOB;
      local_ec0 = SHADERTYPE_COMPUTE;
      local_ec4 = RESOURCETYPE_LOCAL_ARRAY;
      testNdx_1 = 0;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x17,&local_e88,&local_eb0,
                 &local_eb8,&local_ebc,&local_ec0,&local_ec4,(ReadWriteType *)&testNdx_1);
      test_1._7_1_ = 0;
      std::__cxx11::string::~string((string *)&local_eb0);
      std::allocator<char>::~allocator(&local_eb1);
      std::__cxx11::string::~string((string *)&local_e88);
      std::allocator<char>::~allocator(&local_e89);
      std::__cxx11::string::~string((string *)&local_e50);
      std::allocator<char>::~allocator(&local_e51);
      std::__cxx11::string::~string((string *)&local_e28);
      std::allocator<char>::~allocator(&local_e29);
      std::__cxx11::string::~string((string *)&local_df0);
      std::allocator<char>::~allocator(&local_df1);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::allocator<char>::~allocator(&local_dc9);
      std::__cxx11::string::~string((string *)&local_d90);
      std::allocator<char>::~allocator(&local_d91);
      std::__cxx11::string::~string((string *)&local_d68);
      std::allocator<char>::~allocator(&local_d69);
      std::__cxx11::string::~string((string *)&local_d30);
      std::allocator<char>::~allocator(&local_d31);
      std::__cxx11::string::~string((string *)&local_d08);
      std::allocator<char>::~allocator(&local_d09);
      std::__cxx11::string::~string((string *)&local_cd0);
      std::allocator<char>::~allocator(&local_cd1);
      std::__cxx11::string::~string((string *)&local_ca8);
      std::allocator<char>::~allocator(&local_ca9);
      std::__cxx11::string::~string((string *)&local_c70);
      std::allocator<char>::~allocator(&local_c71);
      std::__cxx11::string::~string((string *)&local_c48);
      std::allocator<char>::~allocator(&local_c49);
      std::__cxx11::string::~string((string *)&local_c10);
      std::allocator<char>::~allocator(&local_c11);
      std::__cxx11::string::~string((string *)&local_be8);
      std::allocator<char>::~allocator(&local_be9);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::allocator<char>::~allocator(&local_bb1);
      std::__cxx11::string::~string((string *)&local_b88);
      std::allocator<char>::~allocator(&local_b89);
      std::__cxx11::string::~string((string *)&local_b50);
      std::allocator<char>::~allocator(&local_b51);
      std::__cxx11::string::~string((string *)&local_b28);
      std::allocator<char>::~allocator(&local_b29);
      std::__cxx11::string::~string((string *)&local_af0);
      std::allocator<char>::~allocator(&local_af1);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator(&local_ac9);
      std::__cxx11::string::~string((string *)&local_a90);
      std::allocator<char>::~allocator(&local_a91);
      std::__cxx11::string::~string((string *)&local_a68);
      std::allocator<char>::~allocator(&local_a69);
      std::__cxx11::string::~string((string *)&local_a30);
      std::allocator<char>::~allocator(&local_a31);
      std::__cxx11::string::~string((string *)&local_a08);
      std::allocator<char>::~allocator(&local_a09);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator(&local_9a9);
      std::__cxx11::string::~string((string *)&local_970);
      std::allocator<char>::~allocator(&local_971);
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::allocator<char>::~allocator(&local_8e9);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::allocator<char>::~allocator(&local_8b1);
      std::__cxx11::string::~string((string *)&local_888);
      std::allocator<char>::~allocator(&local_889);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator(&local_7c9);
      std::__cxx11::string::~string((string *)&local_790);
      std::allocator<char>::~allocator(&local_791);
      std::__cxx11::string::~string((string *)&local_768);
      std::allocator<char>::~allocator(&local_769);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator(&local_6d1);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      std::__cxx11::string::~string((string *)&local_670);
      std::allocator<char>::~allocator(&local_671);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator(&local_649);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      __cxa_atexit(__cxx_global_array_dtor_49,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases)
      ;
    }
  }
  for (test_1._0_4_ = 0; (int)test_1 < 0x18; test_1._0_4_ = (int)test_1 + 1) {
    local_ed8 = createRobustnessTests::s_outOfBoundReadCases + (int)test_1;
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_UBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar1 = uboWriteArrayResetTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_f51 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_ef8,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_f50,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_f50);
        local_f51 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_f50);
        std::__cxx11::string::~string((string *)&local_ef8);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_UBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar1 = uboWriteArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_fd1 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_f78,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_fd0,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_fd0);
        local_fd1 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_fd0);
        std::__cxx11::string::~string((string *)&local_f78);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_SSBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar1 = localWriteArrayResetTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1051 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_ff8,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1050,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1050);
        local_1051 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1050);
        std::__cxx11::string::~string((string *)&local_ff8);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_SSBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar1 = localWriteArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_10d1 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_1078,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_10d0,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_10d0);
        local_10d1 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_10d0);
        std::__cxx11::string::~string((string *)&local_1078);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_LOCAL_ARRAY) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar1 = uboReadArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1151 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_10f8,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1150,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1150);
        local_1151 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1150);
        std::__cxx11::string::~string((string *)&local_10f8);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_ed8);
    if (*pRVar11 == RESOURCETYPE_LOCAL_ARRAY) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_ed8);
      pTVar6 = local_5c0;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_11d1 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_ed8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_ed8);
        std::operator+(&local_1178,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_11d0,local_ed8);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_11d0);
        local_11d1 = 0;
        tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_11d0);
        std::__cxx11::string::~string((string *)&local_1178);
      }
    }
  }
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases == '\0') {
    iVar3 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_outOfBoundWriteCases);
    if (iVar3 != 0) {
      test_2._7_1_ = 1;
      local_11e0 = createRobustnessTests::s_outOfBoundWriteCases;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1200,"vertex",&local_1201)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1228,"Provoke a context reset in vertex shader and ",&local_1229);
      local_1230 = ROBUSTACCESS_TRUE;
      local_1234 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1238 = SHADERTYPE_VERT;
      local_123c = RESOURCETYPE_UBO;
      local_1240 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases,&local_1200,&local_1228,&local_1230,
                 &local_1234,&local_1238,&local_123c,&local_1240);
      local_11e0 = (Params *)0x680b28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1260,"fragment",&local_1261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1288,"Provoke a context reset in fragment shader and ",&local_1289
                );
      local_1290 = ROBUSTACCESS_TRUE;
      local_1294 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1298 = SHADERTYPE_FRAG;
      local_129c = RESOURCETYPE_UBO;
      local_12a0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 1,&local_1260,&local_1288,
                 &local_1290,&local_1294,&local_1298,&local_129c,&local_12a0);
      local_11e0 = (Params *)0x680b80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12c0,"vertex_and_fragment",&local_12c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12e8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_12e9);
      local_12f0 = ROBUSTACCESS_TRUE;
      local_12f4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_12f8 = SHADERTYPE_VERT_AND_FRAG;
      local_12fc = RESOURCETYPE_UBO;
      local_1300 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 2,&local_12c0,&local_12e8,
                 &local_12f0,&local_12f4,&local_12f8,&local_12fc,&local_1300);
      local_11e0 = (Params *)0x680bd8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1320,"compute",&local_1321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1348,"Provoke a context reset in compute shader and ",&local_1349)
      ;
      local_1350 = ROBUSTACCESS_TRUE;
      local_1354 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1358 = SHADERTYPE_COMPUTE;
      local_135c = RESOURCETYPE_UBO;
      local_1360 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 3,&local_1320,&local_1348,
                 &local_1350,&local_1354,&local_1358,&local_135c,&local_1360);
      local_11e0 = (Params *)0x680c30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1380,"vertex",&local_1381)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13a8,"Provoke a context reset in vertex shader and ",&local_13a9);
      local_13b0 = ROBUSTACCESS_TRUE;
      local_13b4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_13b8 = SHADERTYPE_VERT;
      local_13bc = RESOURCETYPE_SSBO;
      local_13c0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 4,&local_1380,&local_13a8,
                 &local_13b0,&local_13b4,&local_13b8,&local_13bc,&local_13c0);
      local_11e0 = (Params *)0x680c88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e0,"fragment",&local_13e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1408,"Provoke a context reset in fragment shader and ",&local_1409
                );
      local_1410 = ROBUSTACCESS_TRUE;
      local_1414 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1418 = SHADERTYPE_FRAG;
      local_141c = RESOURCETYPE_SSBO;
      local_1420 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 5,&local_13e0,&local_1408,
                 &local_1410,&local_1414,&local_1418,&local_141c,&local_1420);
      local_11e0 = (Params *)0x680ce0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1440,"vertex_and_fragment",&local_1441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1468,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1469);
      local_1470 = ROBUSTACCESS_TRUE;
      local_1474 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1478 = SHADERTYPE_VERT_AND_FRAG;
      local_147c = RESOURCETYPE_SSBO;
      local_1480 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 6,&local_1440,&local_1468,
                 &local_1470,&local_1474,&local_1478,&local_147c,&local_1480);
      local_11e0 = (Params *)0x680d38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_14a0,"compute",&local_14a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_14c8,"Provoke a context reset in compute shader and ",&local_14c9)
      ;
      local_14d0 = ROBUSTACCESS_TRUE;
      local_14d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_14d8 = SHADERTYPE_COMPUTE;
      local_14dc = RESOURCETYPE_SSBO;
      local_14e0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 7,&local_14a0,&local_14c8,
                 &local_14d0,&local_14d4,&local_14d8,&local_14dc,&local_14e0);
      local_11e0 = (Params *)0x680d90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1500,"vertex",&local_1501)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1528,"Provoke a context reset in vertex shader and ",&local_1529);
      local_1530 = ROBUSTACCESS_TRUE;
      local_1534 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1538 = SHADERTYPE_VERT;
      local_153c = RESOURCETYPE_LOCAL_ARRAY;
      local_1540 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 8,&local_1500,&local_1528,
                 &local_1530,&local_1534,&local_1538,&local_153c,&local_1540);
      local_11e0 = (Params *)0x680de8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1560,"fragment",&local_1561);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1588,"Provoke a context reset in fragment shader and ",&local_1589
                );
      local_1590 = ROBUSTACCESS_TRUE;
      local_1594 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1598 = SHADERTYPE_FRAG;
      local_159c = RESOURCETYPE_LOCAL_ARRAY;
      local_15a0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 9,&local_1560,&local_1588,
                 &local_1590,&local_1594,&local_1598,&local_159c,&local_15a0);
      local_11e0 = (Params *)0x680e40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15c0,"vertex_and_fragment",&local_15c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15e8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_15e9);
      local_15f0 = ROBUSTACCESS_TRUE;
      local_15f4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_15f8 = SHADERTYPE_VERT_AND_FRAG;
      local_15fc = RESOURCETYPE_LOCAL_ARRAY;
      local_1600 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 10,&local_15c0,&local_15e8,
                 &local_15f0,&local_15f4,&local_15f8,&local_15fc,&local_1600);
      local_11e0 = (Params *)0x680e98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1620,"compute",&local_1621);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1648,"Provoke a context reset in compute shader and ",&local_1649)
      ;
      local_1650 = ROBUSTACCESS_TRUE;
      local_1654 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1658 = SHADERTYPE_COMPUTE;
      local_165c = RESOURCETYPE_LOCAL_ARRAY;
      local_1660 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xb,&local_1620,&local_1648,
                 &local_1650,&local_1654,&local_1658,&local_165c,&local_1660);
      local_11e0 = (Params *)0x680ef0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1680,"vertex",&local_1681)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_16a8,"Provoke a context reset in vertex shader and ",&local_16a9);
      local_16b0 = ROBUSTACCESS_FALSE;
      local_16b4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_16b8 = SHADERTYPE_VERT;
      local_16bc = RESOURCETYPE_UBO;
      local_16c0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xc,&local_1680,&local_16a8,
                 &local_16b0,&local_16b4,&local_16b8,&local_16bc,&local_16c0);
      local_11e0 = (Params *)0x680f48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_16e0,"fragment",&local_16e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1708,"Provoke a context reset in fragment shader and ",&local_1709
                );
      local_1710 = ROBUSTACCESS_FALSE;
      local_1714 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1718 = SHADERTYPE_FRAG;
      local_171c = RESOURCETYPE_UBO;
      local_1720 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xd,&local_16e0,&local_1708,
                 &local_1710,&local_1714,&local_1718,&local_171c,&local_1720);
      local_11e0 = (Params *)0x680fa0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1740,"vertex_and_fragment",&local_1741);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1768,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1769);
      local_1770 = ROBUSTACCESS_FALSE;
      local_1774 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1778 = SHADERTYPE_VERT_AND_FRAG;
      local_177c = RESOURCETYPE_UBO;
      local_1780 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xe,&local_1740,&local_1768,
                 &local_1770,&local_1774,&local_1778,&local_177c,&local_1780);
      local_11e0 = (Params *)0x680ff8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17a0,"compute",&local_17a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17c8,"Provoke a context reset in compute shader and ",&local_17c9)
      ;
      local_17d0 = ROBUSTACCESS_FALSE;
      local_17d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_17d8 = SHADERTYPE_COMPUTE;
      local_17dc = RESOURCETYPE_UBO;
      local_17e0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xf,&local_17a0,&local_17c8,
                 &local_17d0,&local_17d4,&local_17d8,&local_17dc,&local_17e0);
      local_11e0 = (Params *)0x681050;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1800,"vertex",&local_1801)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1828,"Provoke a context reset in vertex shader and ",&local_1829);
      local_1830 = ROBUSTACCESS_FALSE;
      local_1834 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1838 = SHADERTYPE_VERT;
      local_183c = RESOURCETYPE_SSBO;
      local_1840 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x10,&local_1800,&local_1828,
                 &local_1830,&local_1834,&local_1838,&local_183c,&local_1840);
      local_11e0 = (Params *)0x6810a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1860,"fragment",&local_1861);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1888,"Provoke a context reset in fragment shader and ",&local_1889
                );
      local_1890 = ROBUSTACCESS_FALSE;
      local_1894 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1898 = SHADERTYPE_FRAG;
      local_189c = RESOURCETYPE_SSBO;
      local_18a0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x11,&local_1860,&local_1888,
                 &local_1890,&local_1894,&local_1898,&local_189c,&local_18a0);
      local_11e0 = (Params *)0x681100;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_18c0,"vertex_and_fragment",&local_18c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_18e8,"Provoke a context reset in vertex and fragment shader and ",
                 &local_18e9);
      local_18f0 = ROBUSTACCESS_FALSE;
      local_18f4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_18f8 = SHADERTYPE_VERT_AND_FRAG;
      local_18fc = RESOURCETYPE_SSBO;
      local_1900 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x12,&local_18c0,&local_18e8,
                 &local_18f0,&local_18f4,&local_18f8,&local_18fc,&local_1900);
      local_11e0 = (Params *)0x681158;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1920,"compute",&local_1921);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1948,"Provoke a context reset in compute shader and ",&local_1949)
      ;
      local_1950 = ROBUSTACCESS_FALSE;
      local_1954 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1958 = SHADERTYPE_COMPUTE;
      local_195c = RESOURCETYPE_SSBO;
      local_1960 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x13,&local_1920,&local_1948,
                 &local_1950,&local_1954,&local_1958,&local_195c,&local_1960);
      local_11e0 = (Params *)0x6811b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1980,"vertex",&local_1981)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_19a8,"Provoke a context reset in vertex shader and ",&local_19a9);
      local_19b0 = ROBUSTACCESS_FALSE;
      local_19b4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_19b8 = SHADERTYPE_VERT;
      local_19bc = RESOURCETYPE_LOCAL_ARRAY;
      local_19c0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x14,&local_1980,&local_19a8,
                 &local_19b0,&local_19b4,&local_19b8,&local_19bc,&local_19c0);
      local_11e0 = (Params *)0x681208;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_19e0,"fragment",&local_19e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a08,"Provoke a context reset in fragment shader and ",&local_1a09
                );
      local_1a10 = ROBUSTACCESS_FALSE;
      local_1a14 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1a18 = SHADERTYPE_FRAG;
      local_1a1c = RESOURCETYPE_LOCAL_ARRAY;
      local_1a20 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x15,&local_19e0,&local_1a08,
                 &local_1a10,&local_1a14,&local_1a18,&local_1a1c,&local_1a20);
      local_11e0 = (Params *)0x681260;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a40,"vertex_and_fragment",&local_1a41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a68,"Provoke a context reset in vertex and fragment shader and ",
                 &local_1a69);
      local_1a70 = ROBUSTACCESS_FALSE;
      local_1a74 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1a78 = SHADERTYPE_VERT_AND_FRAG;
      local_1a7c = RESOURCETYPE_LOCAL_ARRAY;
      local_1a80 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x16,&local_1a40,&local_1a68,
                 &local_1a70,&local_1a74,&local_1a78,&local_1a7c,&local_1a80);
      local_11e0 = (Params *)0x6812b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1aa0,"compute",&local_1aa1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1ac8,"Provoke a context reset in compute shader and ",&local_1ac9)
      ;
      local_1ad0 = ROBUSTACCESS_FALSE;
      local_1ad4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_1ad8 = SHADERTYPE_COMPUTE;
      local_1adc = RESOURCETYPE_LOCAL_ARRAY;
      testNdx_2 = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x17,&local_1aa0,&local_1ac8,
                 &local_1ad0,&local_1ad4,&local_1ad8,&local_1adc,(ReadWriteType *)&testNdx_2);
      test_2._7_1_ = 0;
      std::__cxx11::string::~string((string *)&local_1ac8);
      std::allocator<char>::~allocator(&local_1ac9);
      std::__cxx11::string::~string((string *)&local_1aa0);
      std::allocator<char>::~allocator(&local_1aa1);
      std::__cxx11::string::~string((string *)&local_1a68);
      std::allocator<char>::~allocator(&local_1a69);
      std::__cxx11::string::~string((string *)&local_1a40);
      std::allocator<char>::~allocator(&local_1a41);
      std::__cxx11::string::~string((string *)&local_1a08);
      std::allocator<char>::~allocator(&local_1a09);
      std::__cxx11::string::~string((string *)&local_19e0);
      std::allocator<char>::~allocator(&local_19e1);
      std::__cxx11::string::~string((string *)&local_19a8);
      std::allocator<char>::~allocator(&local_19a9);
      std::__cxx11::string::~string((string *)&local_1980);
      std::allocator<char>::~allocator(&local_1981);
      std::__cxx11::string::~string((string *)&local_1948);
      std::allocator<char>::~allocator(&local_1949);
      std::__cxx11::string::~string((string *)&local_1920);
      std::allocator<char>::~allocator(&local_1921);
      std::__cxx11::string::~string((string *)&local_18e8);
      std::allocator<char>::~allocator(&local_18e9);
      std::__cxx11::string::~string((string *)&local_18c0);
      std::allocator<char>::~allocator(&local_18c1);
      std::__cxx11::string::~string((string *)&local_1888);
      std::allocator<char>::~allocator(&local_1889);
      std::__cxx11::string::~string((string *)&local_1860);
      std::allocator<char>::~allocator(&local_1861);
      std::__cxx11::string::~string((string *)&local_1828);
      std::allocator<char>::~allocator(&local_1829);
      std::__cxx11::string::~string((string *)&local_1800);
      std::allocator<char>::~allocator(&local_1801);
      std::__cxx11::string::~string((string *)&local_17c8);
      std::allocator<char>::~allocator(&local_17c9);
      std::__cxx11::string::~string((string *)&local_17a0);
      std::allocator<char>::~allocator(&local_17a1);
      std::__cxx11::string::~string((string *)&local_1768);
      std::allocator<char>::~allocator(&local_1769);
      std::__cxx11::string::~string((string *)&local_1740);
      std::allocator<char>::~allocator(&local_1741);
      std::__cxx11::string::~string((string *)&local_1708);
      std::allocator<char>::~allocator(&local_1709);
      std::__cxx11::string::~string((string *)&local_16e0);
      std::allocator<char>::~allocator(&local_16e1);
      std::__cxx11::string::~string((string *)&local_16a8);
      std::allocator<char>::~allocator(&local_16a9);
      std::__cxx11::string::~string((string *)&local_1680);
      std::allocator<char>::~allocator(&local_1681);
      std::__cxx11::string::~string((string *)&local_1648);
      std::allocator<char>::~allocator(&local_1649);
      std::__cxx11::string::~string((string *)&local_1620);
      std::allocator<char>::~allocator(&local_1621);
      std::__cxx11::string::~string((string *)&local_15e8);
      std::allocator<char>::~allocator(&local_15e9);
      std::__cxx11::string::~string((string *)&local_15c0);
      std::allocator<char>::~allocator(&local_15c1);
      std::__cxx11::string::~string((string *)&local_1588);
      std::allocator<char>::~allocator(&local_1589);
      std::__cxx11::string::~string((string *)&local_1560);
      std::allocator<char>::~allocator(&local_1561);
      std::__cxx11::string::~string((string *)&local_1528);
      std::allocator<char>::~allocator(&local_1529);
      std::__cxx11::string::~string((string *)&local_1500);
      std::allocator<char>::~allocator(&local_1501);
      std::__cxx11::string::~string((string *)&local_14c8);
      std::allocator<char>::~allocator(&local_14c9);
      std::__cxx11::string::~string((string *)&local_14a0);
      std::allocator<char>::~allocator(&local_14a1);
      std::__cxx11::string::~string((string *)&local_1468);
      std::allocator<char>::~allocator(&local_1469);
      std::__cxx11::string::~string((string *)&local_1440);
      std::allocator<char>::~allocator(&local_1441);
      std::__cxx11::string::~string((string *)&local_1408);
      std::allocator<char>::~allocator(&local_1409);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::allocator<char>::~allocator(&local_13e1);
      std::__cxx11::string::~string((string *)&local_13a8);
      std::allocator<char>::~allocator(&local_13a9);
      std::__cxx11::string::~string((string *)&local_1380);
      std::allocator<char>::~allocator(&local_1381);
      std::__cxx11::string::~string((string *)&local_1348);
      std::allocator<char>::~allocator(&local_1349);
      std::__cxx11::string::~string((string *)&local_1320);
      std::allocator<char>::~allocator(&local_1321);
      std::__cxx11::string::~string((string *)&local_12e8);
      std::allocator<char>::~allocator(&local_12e9);
      std::__cxx11::string::~string((string *)&local_12c0);
      std::allocator<char>::~allocator(&local_12c1);
      std::__cxx11::string::~string((string *)&local_1288);
      std::allocator<char>::~allocator(&local_1289);
      std::__cxx11::string::~string((string *)&local_1260);
      std::allocator<char>::~allocator(&local_1261);
      std::__cxx11::string::~string((string *)&local_1228);
      std::allocator<char>::~allocator(&local_1229);
      std::__cxx11::string::~string((string *)&local_1200);
      std::allocator<char>::~allocator(&local_1201);
      __cxa_atexit(__cxx_global_array_dtor_50,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases
                         );
    }
  }
  for (test_2._0_4_ = 0; (int)test_2 < 0x18; test_2._0_4_ = (int)test_2 + 1) {
    local_1af0 = createRobustnessTests::s_outOfBoundWriteCases + (int)test_2;
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_UBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = ssboWriteArrayResetTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1b69 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1b10,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1b68,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1b68);
        local_1b69 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1b68);
        std::__cxx11::string::~string((string *)&local_1b10);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_UBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = ssboWriteArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1be9 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1b90,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1be8,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1be8);
        local_1be9 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1be8);
        std::__cxx11::string::~string((string *)&local_1b90);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_SSBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = ssboReadArrayResetTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1c69 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1c10,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1c68,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1c68);
        local_1c69 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1c68);
        std::__cxx11::string::~string((string *)&local_1c10);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_SSBO) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = ssboReadArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1ce9 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1c90,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1ce8,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1ce8);
        local_1ce9 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1ce8);
        std::__cxx11::string::~string((string *)&local_1c90);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_LOCAL_ARRAY) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = localReadArrayResetTestGroup;
      if (*pRVar12 == ROBUSTACCESS_TRUE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        local_1d69 = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1d10,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1d68,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1d68);
        local_1d69 = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1d68);
        std::__cxx11::string::~string((string *)&local_1d10);
      }
    }
    pRVar11 = anon_unknown_1::RobustnessTestCase::Params::getResourceType(local_1af0);
    if (*pRVar11 == RESOURCETYPE_LOCAL_ARRAY) {
      pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1af0);
      pTVar1 = localReadArrayResetNonRobustTestGroup;
      if (*pRVar12 == ROBUSTACCESS_FALSE) {
        pTVar7 = (TestNode *)operator_new(0xf8);
        uVar2 = group.
                super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                .m_data._8_8_;
        outOfBoundsResetReadAccessTestGroup._7_1_ = 1;
        (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1af0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        psVar9 = (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                           ((Params *)local_1af0);
        std::operator+(&local_1d90,psVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        pcVar10 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::RobustnessTestCase::Params::Params(&local_1de8,local_1af0);
        anon_unknown_1::BasicResetCase::BasicResetCase
                  ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_1de8);
        outOfBoundsResetReadAccessTestGroup._7_1_ = 0;
        tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
        anon_unknown_1::RobustnessTestCase::Params::~Params(&local_1de8);
        std::__cxx11::string::~string((string *)&local_1d90);
      }
    }
  }
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reads","Out of bounds read accesses");
  outOfBoundsResetWriteAccessTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"writes","Out of bounds write accesses");
  outOfBoundsResetTestGroup = (TestCaseGroup *)pTVar6;
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessTestGroup->super_TestNode,
             &uboWriteArrayResetTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessTestGroup->super_TestNode,
             &localWriteArrayResetTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessTestGroup->super_TestNode,
             &uboReadArrayResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetTestGroup->super_TestNode,
             &ssboWriteArrayResetTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetTestGroup->super_TestNode,&ssboReadArrayResetTestGroup->super_TestNode
            );
  tcu::TestNode::addChild
            (&outOfBoundsResetTestGroup->super_TestNode,
             &localReadArrayResetTestGroup->super_TestNode);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  outOfBoundsResetReadAccessNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  tcu::TestNode::addChild((TestNode *)pTVar6,&outOfBoundsResetWriteAccessTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetReadAccessNonRobustTestGroup->super_TestNode,
             &outOfBoundsResetTestGroup->super_TestNode);
  tcu::TestNode::addChild
            ((TestNode *)this_04,&outOfBoundsResetReadAccessNonRobustTestGroup->super_TestNode);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reads","Out of bounds read accesses");
  outOfBoundsResetWriteAccessNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"writes","Out of bounds write accesses");
  outOfBoundsResetNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessNonRobustTestGroup->super_TestNode,
             &uboWriteArrayResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessNonRobustTestGroup->super_TestNode,
             &localWriteArrayResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetWriteAccessNonRobustTestGroup->super_TestNode,(TestNode *)local_5c0);
  tcu::TestNode::addChild
            (&outOfBoundsResetNonRobustTestGroup->super_TestNode,
             &ssboWriteArrayResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetNonRobustTestGroup->super_TestNode,
             &ssboReadArrayResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&outOfBoundsResetNonRobustTestGroup->super_TestNode,
             &localReadArrayResetNonRobustTestGroup->super_TestNode);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  fixedFunctionResetStatusTestGroup = (TestCaseGroup *)pTVar6;
  tcu::TestNode::addChild
            ((TestNode *)pTVar6,&outOfBoundsResetWriteAccessNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            (&fixedFunctionResetStatusTestGroup->super_TestNode,
             &outOfBoundsResetNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild
            ((TestNode *)resetScenarioDescription.field_2._8_8_,
             &fixedFunctionResetStatusTestGroup->super_TestNode);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  fixedFunctionResetStatusNonRobustTestGroup = (TestCaseGroup *)pTVar6;
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  local_1e30 = pTVar6;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_fixedFunctionPipelineCases == '\0') {
    iVar3 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                 s_fixedFunctionPipelineCases);
    if (iVar3 != 0) {
      test_3._7_1_ = 1;
      local_1e38 = createRobustnessTests::s_fixedFunctionPipelineCases;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e58,"index_buffer_out_of_bounds",&local_1e59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e80,
                 "Provoke context reset and query error states and reset notifications",&local_1e81)
      ;
      local_1e88 = ROBUSTACCESS_TRUE;
      local_1e8c = CONTEXTRESETTYPE_FIXED_FUNC_OOB;
      local_1e90 = FIXEDFUNCTIONTYPE_INDICES;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases,&local_1e58,&local_1e80,
                 &local_1e88,&local_1e8c,&local_1e90);
      local_1e38 = (Params *)0x681378;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1eb0,"vertex_buffer_out_of_bounds",&local_1eb1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1ed8,
                 "Provoke context reset and query error states and reset notifications",&local_1ed9)
      ;
      local_1ee0 = ROBUSTACCESS_TRUE;
      local_1ee4 = CONTEXTRESETTYPE_FIXED_FUNC_OOB;
      local_1ee8 = FIXEDFUNCTIONTYPE_VERTICES;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 1,&local_1eb0,&local_1ed8,
                 &local_1ee0,&local_1ee4,&local_1ee8);
      local_1e38 = (Params *)0x6813d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f08,"index_buffer_out_of_bounds",&local_1f09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f30,
                 "Provoke context reset and query error states and reset notifications",&local_1f31)
      ;
      local_1f38 = ROBUSTACCESS_FALSE;
      local_1f3c = CONTEXTRESETTYPE_FIXED_FUNC_OOB;
      local_1f40 = FIXEDFUNCTIONTYPE_INDICES;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 2,&local_1f08,&local_1f30,
                 &local_1f38,&local_1f3c,&local_1f40);
      local_1e38 = (Params *)0x681428;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f60,"vertex_buffer_out_of_bounds",&local_1f61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f88,
                 "Provoke context reset and query error states and reset notifications",&local_1f89)
      ;
      local_1f90 = ROBUSTACCESS_FALSE;
      local_1f94 = CONTEXTRESETTYPE_FIXED_FUNC_OOB;
      testNdx_3 = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 3,&local_1f60,&local_1f88,
                 &local_1f90,&local_1f94,(FixedFunctionType *)&testNdx_3);
      test_3._7_1_ = 0;
      std::__cxx11::string::~string((string *)&local_1f88);
      std::allocator<char>::~allocator(&local_1f89);
      std::__cxx11::string::~string((string *)&local_1f60);
      std::allocator<char>::~allocator(&local_1f61);
      std::__cxx11::string::~string((string *)&local_1f30);
      std::allocator<char>::~allocator(&local_1f31);
      std::__cxx11::string::~string((string *)&local_1f08);
      std::allocator<char>::~allocator(&local_1f09);
      std::__cxx11::string::~string((string *)&local_1ed8);
      std::allocator<char>::~allocator(&local_1ed9);
      std::__cxx11::string::~string((string *)&local_1eb0);
      std::allocator<char>::~allocator(&local_1eb1);
      std::__cxx11::string::~string((string *)&local_1e80);
      std::allocator<char>::~allocator(&local_1e81);
      std::__cxx11::string::~string((string *)&local_1e58);
      std::allocator<char>::~allocator(&local_1e59);
      __cxa_atexit(__cxx_global_array_dtor_58,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::
                           s_fixedFunctionPipelineCases);
    }
  }
  for (test_3._0_4_ = 0; (int)test_3 < 4; test_3._0_4_ = (int)test_3 + 1) {
    local_1fa8 = createRobustnessTests::s_fixedFunctionPipelineCases + (int)test_3;
    pRVar12 = anon_unknown_1::RobustnessTestCase::Params::getRobustAccessType(local_1fa8);
    pTVar1 = fixedFunctionResetStatusNonRobustTestGroup;
    pTVar6 = local_1e30;
    if (*pRVar12 == ROBUSTACCESS_TRUE) {
      pTVar7 = (TestNode *)operator_new(0xf8);
      uVar2 = group.
              super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
              .m_data._8_8_;
      local_2001 = 1;
      (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1fa8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                ((Params *)local_1fa8);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::RobustnessTestCase::Params::Params(&local_2000,local_1fa8);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_2000);
      local_2001 = 0;
      tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar7);
      anon_unknown_1::RobustnessTestCase::Params::~Params(&local_2000);
    }
    else {
      pTVar7 = (TestNode *)operator_new(0xf8);
      uVar2 = group.
              super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
              .m_data._8_8_;
      (anonymous_namespace)::RobustnessTestCase::Params::getName_abi_cxx11_((Params *)local_1fa8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      (anonymous_namespace)::RobustnessTestCase::Params::getDescription_abi_cxx11_
                ((Params *)local_1fa8);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::RobustnessTestCase::Params::Params(&local_2060,local_1fa8);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar7,(EglTestContext *)uVar2,pcVar8,pcVar10,&local_2060);
      tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
      anon_unknown_1::RobustnessTestCase::Params::~Params(&local_2060);
    }
  }
  tcu::TestNode::addChild
            ((TestNode *)this_01,&fixedFunctionResetStatusNonRobustTestGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)local_1e30);
  pTVar7 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::QueryRobustAccessCase::QueryRobustAccessCase
            ((QueryRobustAccessCase *)pTVar7,
             (EglTestContext *)
             group.
             super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             .m_data._8_8_,"query_robust_access",
             "Query robust access after successfully creating a robust context");
  tcu::TestNode::addChild((TestNode *)pTVar4,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::NoResetNotificationCase::NoResetNotificationCase
            ((NoResetNotificationCase *)pTVar7,
             (EglTestContext *)
             group.
             super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             .m_data._8_8_,"no_reset_notification",
             "Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION");
  tcu::TestNode::addChild((TestNode *)pTVar4,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LoseContextOnResetCase::LoseContextOnResetCase
            ((LoseContextOnResetCase *)pTVar7,
             (EglTestContext *)
             group.
             super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             .m_data._8_8_,"lose_context_on_reset",
             "Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET");
  tcu::TestNode::addChild((TestNode *)pTVar4,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::InvalidContextCase::InvalidContextCase
            ((InvalidContextCase *)pTVar7,
             (EglTestContext *)
             group.
             super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             .m_data._8_8_,"invalid_robust_context_creation",
             "Create a non-robust context but specify a reset notification strategy");
  tcu::TestNode::addChild((TestNode *)this_00,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::InvalidShareContextCase::InvalidShareContextCase
            ((InvalidShareContextCase *)pTVar7,
             (EglTestContext *)
             group.
             super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             .m_data._8_8_,"invalid_robust_shared_context_creation",
             "Create a context share group with conflicting reset notification strategies");
  tcu::TestNode::addChild((TestNode *)this_00,pTVar7);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)this_03);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)this_04);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)resetScenarioDescription.field_2._8_8_);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pTVar5 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar4);
  pTVar4 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this);
  pTVar4 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_00);
  pTVar4 = de::details::
           MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::release
                     ((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  ~MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
           local_20);
  return pTVar4;
}

Assistant:

TestCaseGroup* createRobustnessTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "robustness", "KHR_robustness tests"));

	tcu::TestCaseGroup* const contextCreationTestGroup			= new TestCaseGroup(eglTestCtx, "create_context",						"Test valid context_creation attributes");
	tcu::TestCaseGroup* const contextResetTestGroup				= new TestCaseGroup(eglTestCtx, "reset_context",						"Test context resets scenarios");
	tcu::TestCaseGroup* const negativeContextTestGroup			= new TestCaseGroup(eglTestCtx, "negative_context",						"Test invalid context creation attributes");

	tcu::TestCaseGroup* const shadersTestGroup					= new TestCaseGroup(eglTestCtx, "shaders",								"Shader specific context reset tests");
	tcu::TestCaseGroup* const fixedFunctionTestGroup			= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline",				"Fixed function pipeline context reset tests with robust context");
	tcu::TestCaseGroup* const fixedFunctionNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline_non_robust",	"Fixed function pipeline context reset tests with non-robust context");

	tcu::TestCaseGroup* const infiniteLoopTestGroup				= new TestCaseGroup(eglTestCtx, "infinite_loop",						"Infinite loop scenarios");
	tcu::TestCaseGroup* const outOfBoundsTestGroup				= new TestCaseGroup(eglTestCtx, "out_of_bounds",						"Out of bounds access scenarios with robust context");

	tcu::TestCaseGroup* const outOfBoundsNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "out_of_bounds_non_robust",				"Out of bounds access scenarios with non-robust context");

	const string resetScenarioDescription	= "query error states and reset notifications";
	const string syncScenarioDescription	= "query sync status with getSynciv()";
	const string queryScenarioDescription	= "check availability of query result with getQueryObjectiv()";
	const string sharedScenarioDescription	= "check reset notification is propagated to shared context";
	const string recoverScenarioDescription	= "delete the old context and create a new one";

	// infinite loop test cases
	{
		tcu::TestCaseGroup* const infiniteLoopResetTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",				"Tests that query the reset status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSyncTestGroup		= new TestCaseGroup(eglTestCtx, "sync_status",				"Tests that query the sync status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopQueryTestGroup	= new TestCaseGroup(eglTestCtx, "query_status",				"Tests that query the state of a query object after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSharedTestGroup	= new TestCaseGroup(eglTestCtx, "shared_context_status",	"Tests that query the state of a shared context after a reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopRecoverTestGroup	= new TestCaseGroup(eglTestCtx, "recover_from_reset",		"Tests that attempt to create a new context after a context has occurred");

		static const RobustnessTestCase::Params s_infiniteLoopCases[] =
		{
			RobustnessTestCase::Params("vertex",				"Provoke a context reset in vertex shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT),
			RobustnessTestCase::Params("fragment",				"Provoke a context reset in fragment shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_FRAG),
			RobustnessTestCase::Params("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT_AND_FRAG),
			RobustnessTestCase::Params("compute",				"Provoke a context reset in compute shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_COMPUTE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_infiniteLoopCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_infiniteLoopCases[testNdx];
			infiniteLoopResetTestGroup->addChild	(new BasicResetCase				(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
			infiniteLoopSyncTestGroup->addChild		(new SyncObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + syncScenarioDescription).c_str(), test));
			infiniteLoopQueryTestGroup->addChild	(new QueryObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + queryScenarioDescription).c_str(), test));
			infiniteLoopSharedTestGroup->addChild	(new SharedContextResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + sharedScenarioDescription).c_str(), test));
			infiniteLoopRecoverTestGroup->addChild	(new RecoverFromResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + recoverScenarioDescription).c_str(), test));
		}

		infiniteLoopTestGroup->addChild(infiniteLoopResetTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSyncTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopQueryTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSharedTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopRecoverTestGroup);
	}

	// out-of-bounds test cases
	{
		// robust context
		tcu::TestCaseGroup* const uboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const uboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		static const RobustnessTestCase::Params s_outOfBoundReadCases[] =
		{
			// ubo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),

			// ubo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundReadCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundReadCases[testNdx];

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				uboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				uboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				ssboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				ssboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				localReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				localReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		static const RobustnessTestCase::Params s_outOfBoundWriteCases[] =
		{
			// ubo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),

			// ubo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundWriteCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundWriteCases[testNdx];

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					uboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					uboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					ssboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					ssboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					localWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					localWriteArrayResetNonRobustTestGroup->addChild	(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		// robust Context
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessTestGroup->addChild(uboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(ssboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(localReadArrayResetTestGroup);

		outOfBoundsResetWriteAccessTestGroup->addChild(uboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(ssboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(localWriteArrayResetTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetTestGroup->addChild(outOfBoundsResetReadAccessTestGroup);
		outOfBoundsResetTestGroup->addChild(outOfBoundsResetWriteAccessTestGroup);

		outOfBoundsTestGroup->addChild(outOfBoundsResetTestGroup);

		// non-robust Context (internal use only)
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(uboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(ssboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(localReadArrayResetNonRobustTestGroup);

		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(uboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(ssboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(localWriteArrayResetNonRobustTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetReadAccessNonRobustTestGroup);
		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetWriteAccessNonRobustTestGroup);

		outOfBoundsNonRobustTestGroup->addChild(outOfBoundsResetNonRobustTestGroup);
	}

	// fixed function test cases
	{
		// robust context
		tcu::TestCaseGroup* const fixedFunctionResetStatusTestGroup				= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const fixedFunctionResetStatusNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		static const RobustnessTestCase::Params s_fixedFunctionPipelineCases[] =
		{
			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),

			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_fixedFunctionPipelineCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_fixedFunctionPipelineCases[testNdx];
			if (test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				fixedFunctionResetStatusTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
			else
				fixedFunctionResetStatusNonRobustTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
		}

		fixedFunctionTestGroup->addChild(fixedFunctionResetStatusTestGroup);
		fixedFunctionNonRobustTestGroup->addChild(fixedFunctionResetStatusNonRobustTestGroup);
	}

	// context creation query cases
	{
		contextCreationTestGroup->addChild(new QueryRobustAccessCase	(eglTestCtx, "query_robust_access",		"Query robust access after successfully creating a robust context"));
		contextCreationTestGroup->addChild(new NoResetNotificationCase	(eglTestCtx, "no_reset_notification",	"Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION"));
		contextCreationTestGroup->addChild(new LoseContextOnResetCase	(eglTestCtx, "lose_context_on_reset",	"Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET"));
	}

	// invalid context creation cases
	{
		negativeContextTestGroup->addChild(new InvalidContextCase		(eglTestCtx, "invalid_robust_context_creation",			"Create a non-robust context but specify a reset notification strategy"));
		negativeContextTestGroup->addChild(new InvalidShareContextCase	(eglTestCtx, "invalid_robust_shared_context_creation",	"Create a context share group with conflicting reset notification strategies"));
	}

	shadersTestGroup->addChild(infiniteLoopTestGroup);
	shadersTestGroup->addChild(outOfBoundsTestGroup);
	shadersTestGroup->addChild(outOfBoundsNonRobustTestGroup);

	contextResetTestGroup->addChild(shadersTestGroup);
	contextResetTestGroup->addChild(fixedFunctionTestGroup);
	contextResetTestGroup->addChild(fixedFunctionNonRobustTestGroup);

	group->addChild(contextCreationTestGroup);
	group->addChild(contextResetTestGroup);
	group->addChild(negativeContextTestGroup);

	return group.release();
}